

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedIdentifiers
          (Parser *this,EnumDescriptorProto *proto,LocationRecorder *parent_location)

{
  Location *parent;
  bool bVar1;
  int path1;
  string *name;
  string_view local_88;
  string_view local_78;
  uint local_64;
  ErrorMaker local_60 [2];
  undefined1 local_40 [8];
  LocationRecorder location;
  LocationRecorder *parent_location_local;
  EnumDescriptorProto *proto_local;
  Parser *this_local;
  
  location.location_ = (Location *)parent_location;
  do {
    parent = location.location_;
    path1 = EnumDescriptorProto::reserved_name_size(proto);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_40,(LocationRecorder *)parent,path1);
    name = EnumDescriptorProto::add_reserved_name_abi_cxx11_(proto);
    ErrorMaker::ErrorMaker(local_60,"Expected enum value identifier.");
    bVar1 = ParseReservedIdentifier(this,name,local_60[0]);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    local_64 = (uint)!bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    if (local_64 != 0) goto LAB_005a1a57;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,",");
    bVar1 = TryConsume(this,local_78);
  } while (bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,";");
  bVar1 = ConsumeEndOfDeclaration(this,local_88,(LocationRecorder *)location.location_);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005a1a57:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseReservedIdentifiers(EnumDescriptorProto* proto,
                                      const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, proto->reserved_name_size());
    DO(ParseReservedIdentifier(proto->add_reserved_name(),
                               "Expected enum value identifier."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}